

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event_timer.h
# Opt level: O0

void ngx_event_add_timer(ngx_event_t *ev,ngx_msec_t timer)

{
  ngx_rbtree_key_t nVar1;
  long local_30;
  ngx_msec_int_t diff;
  ngx_msec_t key;
  ngx_msec_t timer_local;
  ngx_event_t *ev_local;
  
  nVar1 = ngx_current_msec + timer;
  if ((*(uint *)&ev->field_0x8 >> 0xb & 1) != 0) {
    local_30 = nVar1 - (ev->timer).key;
    if (local_30 < 0) {
      local_30 = -local_30;
    }
    if (local_30 < 300) {
      if ((ev->log->log_level & 0x80) == 0) {
        return;
      }
      ngx_log_error_core(8,ev->log,0,"event timer: %d, old: %M, new: %M",
                         (ulong)*(uint *)((long)ev->data + 0x18),(ev->timer).key,nVar1);
      return;
    }
    ngx_event_del_timer(ev);
  }
  (ev->timer).key = nVar1;
  if ((ev->log->log_level & 0x80) != 0) {
    ngx_log_error_core(8,ev->log,0,"event timer add: %d: %M:%M",
                       (ulong)*(uint *)((long)ev->data + 0x18),timer,(ev->timer).key);
  }
  ngx_rbtree_insert(&ngx_event_timer_rbtree,&ev->timer);
  *(uint *)&ev->field_0x8 = *(uint *)&ev->field_0x8 & 0xfffff7ff | 0x800;
  return;
}

Assistant:

static ngx_inline void
ngx_event_add_timer(ngx_event_t *ev, ngx_msec_t timer)
{
    ngx_msec_t      key;
    ngx_msec_int_t  diff;

    key = ngx_current_msec + timer;

    if (ev->timer_set) {

        /*
         * Use a previous timer value if difference between it and a new
         * value is less than NGX_TIMER_LAZY_DELAY milliseconds: this allows
         * to minimize the rbtree operations for fast connections.
         */

        diff = (ngx_msec_int_t) (key - ev->timer.key);

        if (ngx_abs(diff) < NGX_TIMER_LAZY_DELAY) {
            ngx_log_debug3(NGX_LOG_DEBUG_EVENT, ev->log, 0,
                           "event timer: %d, old: %M, new: %M",
                            ngx_event_ident(ev->data), ev->timer.key, key);
            return;
        }

        ngx_del_timer(ev);
    }

    ev->timer.key = key;

    ngx_log_debug3(NGX_LOG_DEBUG_EVENT, ev->log, 0,
                   "event timer add: %d: %M:%M",
                    ngx_event_ident(ev->data), timer, ev->timer.key);

    ngx_rbtree_insert(&ngx_event_timer_rbtree, &ev->timer);

    ev->timer_set = 1;
}